

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O0

void __thiscall
capnp::
CallContext<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyParams,_capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>
::setPipeline(CallContext<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyParams,_capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>
              *this,Pipeline *pipeline)

{
  CallContextHook *pCVar1;
  Pipeline *pipeline_00;
  Own<capnp::PipelineHook,_std::nullptr_t> OVar2;
  Own<capnp::PipelineHook,_std::nullptr_t> local_28;
  Pipeline *local_18;
  Pipeline *pipeline_local;
  CallContext<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyParams,_capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>
  *this_local;
  
  pCVar1 = this->hook;
  local_18 = pipeline;
  pipeline_local = (Pipeline *)this;
  pipeline_00 = kj::
                mv<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults::Pipeline>
                          (pipeline);
  OVar2 = PipelineHook::
          from<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults::Pipeline,capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>
                    ((PipelineHook *)&local_28,pipeline_00);
  (*pCVar1->_vptr_CallContextHook[4])(pCVar1,&local_28,OVar2.ptr);
  kj::Own<capnp::PipelineHook,_std::nullptr_t>::~Own(&local_28);
  return;
}

Assistant:

void CallContext<Params, Results>::setPipeline(typename Results::Pipeline&& pipeline) {
  hook->setPipeline(PipelineHook::from(kj::mv(pipeline)));
}